

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_b_mean(double mu,double s,double b)

{
  double dVar1;
  double dVar2;
  double mean;
  double beta_pdf;
  double beta_cdf;
  double beta;
  double b_local;
  double s_local;
  double mu_local;
  
  dVar1 = (b - mu) / s;
  dVar2 = normal_01_cdf(dVar1);
  dVar1 = normal_01_pdf(dVar1);
  return mu - (s * dVar1) / dVar2;
}

Assistant:

double normal_truncated_b_mean ( double mu, double s, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_B_MEAN returns the mean of the upper truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviatione of the
//    parent Normal distribution.
//
//    Input, double B, the upper truncation limit.
//
//    Output, double NORMAL_TRUNCATED_B_MEAN, the mean of the PDF.
//
{
  double beta;
  double beta_cdf;
  double beta_pdf;
  double mean;

  beta = ( b - mu ) / s;

  beta_cdf = normal_01_cdf ( beta );

  beta_pdf = normal_01_pdf ( beta );

  mean = mu - s * beta_pdf / beta_cdf;

  return mean;
}